

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O1

int tpm_socket_read(TPM_SOCKET_HANDLE handle,uchar *tpm_bytes,uint32_t bytes_len)

{
  ulong uVar1;
  LOGGER_LOG p_Var2;
  ssize_t sVar3;
  uchar *puVar4;
  uchar *__dest;
  int iVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  ulong __size;
  size_t sVar9;
  ulong __n;
  undefined1 local_438 [1032];
  
  if (bytes_len == 0 || (tpm_bytes == (uchar *)0x0 || handle == (TPM_SOCKET_HANDLE)0x0)) {
    p_Var2 = xlogging_get_log_function();
    iVar5 = 0x101;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_read",0x100,1,
                "Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d",handle,
                tpm_bytes,(ulong)bytes_len);
    }
  }
  else {
    __n = (ulong)bytes_len;
    lVar6 = 1;
    do {
      if (__n <= handle->recv_length) {
        memcpy(tpm_bytes,handle->recv_bytes,__n);
        sVar9 = handle->recv_length - __n;
        if (sVar9 == 0) {
          free(handle->recv_bytes);
          handle->recv_bytes = (uchar *)0x0;
          handle->recv_length = 0;
          return 0;
        }
        if (sVar9 == 0xffffffffffffffff || handle->recv_length < __n) {
          return 0;
        }
        __dest = (uchar *)malloc(sVar9);
        puVar4 = handle->recv_bytes;
        memcpy(__dest,puVar4 + __n,sVar9);
        free(puVar4);
        handle->recv_bytes = __dest;
        handle->recv_length = sVar9;
        return 0;
      }
      sVar3 = recv(handle->socket_conn,local_438,0x400,0);
      if ((int)sVar3 == -1) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010e975;
        pcVar7 = "Failure received bytes timed out.";
        iVar5 = 0xa2;
LAB_0010e96a:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"read_socket_bytes",iVar5,1,pcVar7);
LAB_0010e975:
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x115;
        }
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"tpm_socket_read",0x114,1,"Failure reading socket bytes.");
        return 0x115;
      }
      __size = (ulong)(int)sVar3;
      if (handle->recv_bytes == (uchar *)0x0) {
        puVar4 = (uchar *)malloc(__size);
      }
      else {
        sVar9 = 0xffffffffffffffff;
        if (!CARRY8(handle->recv_length,__size)) {
          sVar9 = handle->recv_length + __size;
        }
        if (sVar9 == 0xffffffffffffffff) {
          puVar4 = (uchar *)0x0;
        }
        else {
          puVar4 = (uchar *)realloc(handle->recv_bytes,sVar9);
        }
      }
      if (puVar4 == (uchar *)0x0) {
LAB_0010e941:
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010e975;
        pcVar7 = "Failure: adding bytes to buffer.";
        iVar5 = 0xb1;
        goto LAB_0010e96a;
      }
      uVar1 = handle->recv_length;
      sVar8 = __size + uVar1;
      if (CARRY8(__size,uVar1)) {
        sVar8 = 0xffffffffffffffff;
      }
      if (sVar8 == 0xffffffffffffffff) {
        free(puVar4);
        goto LAB_0010e941;
      }
      handle->recv_bytes = puVar4;
      memcpy(puVar4 + uVar1,local_438,__size);
      handle->recv_length = sVar8;
      lVar6 = lVar6 + -1;
    } while (lVar6 == 0);
    iVar5 = 0x106;
  }
  return iVar5;
}

Assistant:

int tpm_socket_read(TPM_SOCKET_HANDLE handle, unsigned char* tpm_bytes, uint32_t bytes_len)
{
    int result;
    if (handle == NULL || tpm_bytes == NULL || bytes_len == 0)
    {
        LogError("Invalid argument specified handle: %p, tpm_bytes: %p, bytes_len: %d", handle, tpm_bytes, bytes_len);
        result = MU_FAILURE;
    }
    else
    {
        // Do we have enough bytes cached
        result = MU_FAILURE;
        for (size_t index = 0; index < 2; index++)
        {
            if (handle->recv_length >= bytes_len)
            {
                memcpy(tpm_bytes, handle->recv_bytes, bytes_len);
                remove_from_buffer(handle, bytes_len);
                result = 0;
                break;
            }
            else
            {
                if (read_socket_bytes(handle))
                {
                    LogError("Failure reading socket bytes.");
                    result = MU_FAILURE;
                    break;
                }
            }
        }
    }
    return result;
}